

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.hpp
# Opt level: O0

void __thiscall helics::apps::WebServer::WebServer(WebServer *this,string_view server_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 uVar1;
  atomic<bool> *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> *in_stack_ffffffffffffffe0;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  
  uVar1 = (undefined1)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  __t = in_RDI;
  TypedBrokerServer::TypedBrokerServer((TypedBrokerServer *)in_RDI);
  in_RDI->_M_len = (size_t)&PTR__WebServer_00a43f38;
  CLI::std::atomic<bool>::atomic(in_stack_ffffffffffffffb0,(bool)uVar1);
  uVar1 = (undefined1)((ulong)(in_RDI + 1) >> 0x38);
  CLI::std::shared_ptr<helics::apps::IocWrapper>::shared_ptr
            ((shared_ptr<helics::apps::IocWrapper> *)0x1f4a12);
  this_00 = in_RDI + 2;
  CLI::std::thread::thread((thread *)0x1f4a25);
  CLI::std::mutex::mutex((mutex *)0x1f4a33);
  in_RDI[5]._M_len = 0;
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_RDI[5]._M_str;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_RSI,__t,in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  *(undefined4 *)&in_RDI[0xb]._M_str = 0xaa16;
  std::__cxx11::string::string(this_01);
  *(undefined4 *)&in_RDI[0xe]._M_len = 0xaa17;
  *(undefined1 *)((long)&in_RDI[0xe]._M_len + 4) = 0;
  *(undefined1 *)((long)&in_RDI[0xe]._M_len + 5) = 0;
  *(undefined4 *)&in_RDI[0xe]._M_str = 0;
  CLI::std::atomic<bool>::atomic((atomic<bool> *)this_00,(bool)uVar1);
  return;
}

Assistant:

explicit WebServer(std::string_view server_name): mName(server_name) {}